

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O1

Expression * __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::Slot::makeExpr(Slot *this,Module *module)

{
  size_t sVar1;
  Expression *pEVar2;
  Binary *pBVar3;
  Const *pCVar4;
  Binary *this_00;
  Builder local_30;
  Builder builder;
  
  sVar1 = (this->global).super_IString.str._M_len;
  local_30.wasm = module;
  if (sVar1 == 0) {
    this_00 = (Binary *)Builder::makeConst<int>(&local_30,this->index);
  }
  else {
    pEVar2 = (Expression *)(this->global).super_IString.str._M_str;
    pBVar3 = (Binary *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = GlobalGetId;
    (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    *(undefined8 *)&pBVar3->op = 0;
    *(size_t *)&pBVar3->op = sVar1;
    pBVar3->left = pEVar2;
    (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 2;
    this_00 = pBVar3;
    if (this->index != 0) {
      pCVar4 = Builder::makeConst<int>(&local_30,this->index);
      this_00 = (Binary *)MixedArena::allocSpace(&(local_30.wasm)->allocator,0x28,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_00->op = AddInt32;
      this_00->left = (Expression *)pBVar3;
      this_00->right = (Expression *)pCVar4;
      Binary::finalize(this_00);
    }
  }
  return (Expression *)this_00;
}

Assistant:

Expression* TableSlotManager::Slot::makeExpr(Module& module) {
  Builder builder(module);
  auto makeIndex = [&]() { return builder.makeConst(int32_t(index)); };
  if (global.size()) {
    Expression* getBase = builder.makeGlobalGet(global, Type::i32);
    return index == 0 ? getBase
                      : builder.makeBinary(AddInt32, getBase, makeIndex());
  } else {
    return makeIndex();
  }
}